

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgInitMan(Abc_TgMan_t *pMan,word *pTruth,int nVars,int nAlg,Vec_Int_t *vPhase)

{
  char cVar1;
  int local_2c;
  int i;
  Vec_Int_t *vPhase_local;
  int nAlg_local;
  int nVars_local;
  word *pTruth_local;
  Abc_TgMan_t *pMan_local;
  
  pMan->pTruth = pTruth;
  pMan->uPhase = 0;
  pMan->fPhased = 0;
  pMan->nGVars = nVars;
  pMan->nVars = nVars;
  pMan->nGroups = 1;
  pMan->pGroup[0].iStart = '\0';
  pMan->pGroup[0].nGVars = (char)nVars;
  for (local_2c = 0; local_2c < nVars; local_2c = local_2c + 1) {
    cVar1 = (char)local_2c;
    pMan->pPerm[local_2c] = cVar1;
    pMan->pPermT[local_2c] = cVar1;
    pMan->pPermTRev[local_2c] = cVar1;
    pMan->symPhase[local_2c] = '\x01';
    pMan->symLink[local_2c] = -1;
  }
  pMan->symLink[local_2c] = -1;
  pMan->nAlgorithm = nAlg;
  pMan->vPhase = vPhase;
  Vec_IntClear(vPhase);
  return;
}

Assistant:

static void Abc_TgInitMan(Abc_TgMan_t * pMan, word * pTruth, int nVars, int nAlg, Vec_Int_t * vPhase)
{
    int i;
    pMan->pTruth = pTruth;
    pMan->uPhase = 0;
    pMan->fPhased = 0;
    pMan->nVars = pMan->nGVars = nVars;
    pMan->nGroups = 1;
    pMan->pGroup[0].iStart = 0;
    pMan->pGroup[0].nGVars = nVars;
    for (i = 0; i < nVars; i++)
    {
        pMan->pPerm[i] = i;
        pMan->pPermT[i] = i;
        pMan->pPermTRev[i] = i;
        pMan->symPhase[i] = 1;
        pMan->symLink[i] = -1;
    }
    pMan->symLink[i] = -1;
    pMan->nAlgorithm = nAlg;
    pMan->vPhase = vPhase;
    Vec_IntClear(vPhase);
}